

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QSize>::emplace<QSize>
          (QMovableArrayOps<QSize> *this,qsizetype i,QSize *args)

{
  QSize **ppQVar1;
  Data *pDVar2;
  long lVar3;
  QSize QVar4;
  QSize *pQVar5;
  qsizetype *pqVar6;
  bool bVar7;
  
  pDVar2 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0026b245:
    QVar4 = *args;
    bVar7 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size != 0;
    QArrayDataPointer<QSize>::detachAndGrow
              ((QArrayDataPointer<QSize> *)this,(uint)(i == 0 && bVar7),1,(QSize **)0x0,
               (QArrayDataPointer<QSize> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr;
    if (i != 0 || !bVar7) {
      memmove(pQVar5 + i + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size - i) * 8);
      pQVar5[i] = QVar4;
      goto LAB_0026b2aa;
    }
    pQVar5[-1] = QVar4;
  }
  else {
    lVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size;
    if ((lVar3 == i && pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar3)) {
      (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr[lVar3] = *args;
      goto LAB_0026b2aa;
    }
    if (((i != 0) || (pDVar2 == (Data *)0x0)) ||
       ((QSize *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr))
    goto LAB_0026b245;
    (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr[-1] = *args;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0026b2aa:
  pqVar6 = &(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size;
  *pqVar6 = *pqVar6 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }